

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

RGB __thiscall pbrt::MIPMap::Texel<pbrt::RGB>(MIPMap *this,int level,Point2i st)

{
  Image *pIVar1;
  ulong uVar2;
  Float *pFVar3;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  int c;
  int c_00;
  Float FVar4;
  RGB RVar5;
  Float local_44;
  undefined8 local_40;
  int vb;
  int va;
  
  if ((-1 < level) && (uVar2 = (ulong)(uint)level, uVar2 < (this->pyramid).nStored)) {
    pIVar1 = (this->pyramid).ptr;
    vb = (int)pIVar1[uVar2].channelNames.nStored;
    if (vb - 3U < 2) {
      local_40 = 0;
      local_44 = 0.0;
      c_00 = 0;
      do {
        wrapMode.wrap.values[1] = this->wrapMode;
        wrapMode.wrap.values[0] = this->wrapMode;
        FVar4 = Image::GetChannel((this->pyramid).ptr + uVar2,st,c_00,wrapMode);
        pFVar3 = (Float *)&local_40;
        if ((c_00 != 0) && (pFVar3 = (Float *)((long)&local_40 + 4), c_00 != 1)) {
          pFVar3 = &local_44;
        }
        *pFVar3 = FVar4;
        c_00 = c_00 + 1;
      } while (c_00 != 3);
    }
    else {
      va = 1;
      if (vb != 1) {
        LogFatal<char_const(&)[2],char_const(&)[27],char_const(&)[2],int&,char_const(&)[27],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
                   ,0xd9,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2cbe3e8,
                   (char (*) [27])"pyramid[level].NChannels()",(char (*) [2])0x2cbe3e8,&va,
                   (char (*) [27])"pyramid[level].NChannels()",&vb);
      }
      wrapMode_00.wrap.values[1] = this->wrapMode;
      wrapMode_00.wrap.values[0] = this->wrapMode;
      local_44 = Image::GetChannel(pIVar1 + uVar2,st,0,wrapMode_00);
      local_40 = CONCAT44(local_44,local_44);
    }
    RVar5.b = local_44;
    RVar5.r = (Float)(undefined4)local_40;
    RVar5.g = (Float)local_40._4_4_;
    return RVar5;
  }
  LogFatal<char_const(&)[37]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
             ,0xd2,"Check failed: %s",(char (*) [37])"level >= 0 && level < pyramid.size()");
}

Assistant:

RGB MIPMap::Texel(int level, Point2i st) const {
    CHECK(level >= 0 && level < pyramid.size());
    if (pyramid[level].NChannels() == 3 || pyramid[level].NChannels() == 4) {
        RGB rgb;
        for (int c = 0; c < 3; ++c)
            rgb[c] = pyramid[level].GetChannel(st, c, wrapMode);
        return rgb;
    } else {
        CHECK_EQ(1, pyramid[level].NChannels());
        Float v = pyramid[level].GetChannel(st, 0, wrapMode);
        return RGB(v, v, v);
    }
}